

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool ON_IsCurvatureDiscontinuity
               (ON_3dVector Km,ON_3dVector Kp,double cos_angle_tolerance,double curvature_tolerance,
               double zero_curvature,double radius_tolerance,double relative_tolerance)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double local_98;
  double KmoKp;
  bool bDifferentScalars;
  double dStack_68;
  bool bPointOfInflection;
  double kp;
  double km;
  double local_40;
  double d;
  double relative_tolerance_local;
  double radius_tolerance_local;
  double zero_curvature_local;
  double curvature_tolerance_local;
  double cos_angle_tolerance_local;
  
  d = relative_tolerance;
  relative_tolerance_local = radius_tolerance;
  radius_tolerance_local = zero_curvature;
  zero_curvature_local = curvature_tolerance;
  curvature_tolerance_local = cos_angle_tolerance;
  ON_3dVector::operator-((ON_3dVector *)&km,&Km,&Kp);
  local_40 = ON_3dVector::Length((ON_3dVector *)&km);
  bVar2 = ON_IsValid(local_40);
  if (bVar2) {
    if ((local_40 <= 0.0) || (local_40 <= zero_curvature_local)) {
      cos_angle_tolerance_local._7_1_ = false;
    }
    else {
      if (radius_tolerance_local <= 7.7037197787136e-34) {
        radius_tolerance_local = 7.7037197787136e-34;
      }
      kp = ON_3dVector::Length(&Km);
      dStack_68 = ON_3dVector::Length(&Kp);
      if (kp <= radius_tolerance_local) {
        kp = 0.0;
      }
      if (dStack_68 <= radius_tolerance_local) {
        dStack_68 = 0.0;
        if ((kp == 0.0) && (!NAN(kp))) {
          return false;
        }
      }
      if ((kp <= 0.0) || (dStack_68 <= 0.0)) {
        cos_angle_tolerance_local._7_1_ = true;
      }
      else {
        bVar2 = 0.0 < zero_curvature_local;
        bVar1 = bVar2;
        if ((-1.0 <= curvature_tolerance_local) && (curvature_tolerance_local <= 1.0)) {
          dVar3 = ON_3dVector::operator*(&Kp,&Km);
          if (dVar3 < kp * dStack_68 * curvature_tolerance_local) {
            return true;
          }
          bVar1 = false;
        }
        if (0.0 <= relative_tolerance_local) {
          if (dStack_68 * kp * relative_tolerance_local < ABS(kp - dStack_68)) {
            return true;
          }
          bVar2 = false;
        }
        if (0.0 < d) {
          if (kp <= dStack_68) {
            local_98 = dStack_68;
          }
          else {
            local_98 = kp;
          }
          if (local_98 * d < ABS(kp - dStack_68)) {
            return true;
          }
          bVar2 = false;
        }
        if ((bVar1) || (bVar2)) {
          cos_angle_tolerance_local._7_1_ = true;
        }
        else {
          cos_angle_tolerance_local._7_1_ = false;
        }
      }
    }
  }
  else {
    cos_angle_tolerance_local._7_1_ = true;
  }
  return cos_angle_tolerance_local._7_1_;
}

Assistant:

bool ON_IsCurvatureDiscontinuity( 
  const ON_3dVector Km, 
  const ON_3dVector Kp,
  double cos_angle_tolerance,
  double curvature_tolerance,
  double zero_curvature,
  double radius_tolerance,
  double relative_tolerance
  )
{
  const double d = (Km-Kp).Length();
  if ( !ON_IsValid(d) )
  {
    // invalid curvatures - call it discontinuous because
    // there is a good chance the derivative evaluation 
    // failed or the first derivative is zero.
    return true;
  }

  // The d <= 0.0 test handles the case when 
  // curvature_tolerance is ON_UNSET_VALUE
  if ( d <= 0.0 || d <= curvature_tolerance )
    return false; // "equal" curvature vectors

  // If the scalar curvature is <= zero_curvature,
  // then K is small enough that we assume it is zero.
  // The primary reason for doing this is to prevent
  // reporting a curvature discontinuity when one
  // or both of the curvatures is small1.0e-300 and 1.0e-200
  if ( !(zero_curvature > 7.7037197787136e-34) )
    zero_curvature = 7.7037197787136e-34;
  double km = Km.Length();
  double kp = Kp.Length();
  // If km or kp are NaNs, I treat them as zero so
  // the rest of this code can assume they are 0.0
  // or positive.
  if ( !(km > zero_curvature) )
    km = 0.0;
  if ( !(kp > zero_curvature) )
  {
    kp = 0.0;
    if ( 0.0 == km )
    {
      // both curvatures are "zero"
      return false;
    }
  }

  if ( !(km > 0.0 && kp > 0.0) )
  {
    // one side is flat and the other is curved.
    return true;
  }

  // Nov 1, 2012 Dale Lear
  // This test was wrong.  Read the description of the curvature_tolerance
  // parameter in the header file.
  //////if ( 0.0 == curvature_tolerance )
  //////{
  //////  // User is asking for exact match.
  //////  return true;
  //////}

  // At this point we know km > 0 and kp > 0.

  bool bPointOfInflection = (curvature_tolerance > 0.0);
  bool bDifferentScalars = bPointOfInflection;
  // NOTE: 
  //   At this point either curvature_tolerance was not
  //   specified or |Km - Kp| > curvature_tolerance. Because
  //   it is difficult to come up with a meaningful value for
  //   curvature_tolerance that works at all scales, the
  //   additional tests below are used to determine if 
  //   Km and Kp are different enough to matter. If additional
  //   tests are performed, then bTestCurvatureTolerance
  //   is set to false. If no additional tests are performed,
  //   then bTestCurvatureTolerance will remain true and
  //   the |Km-Kp| > curvature_tolerance test is performed
  //   at the end of this function.

  if ( cos_angle_tolerance >= -1.0 && cos_angle_tolerance <= 1.0 )
  {
    const double KmoKp = Kp*Km;
    if ( KmoKp < km*kp*cos_angle_tolerance )
      return true; // Km and Kp are not parallel
    bPointOfInflection = false;
  }

  // At this point we assume Km and Kp are parallel and we
  // know km > 0 and kp > 0.
  if ( radius_tolerance >= 0.0 )
  {
    // This test is if (fabs(rm - rp) > radius_tolerance) return true
    // where rm = 1.0/km and rp = 1.0/kp.  It is coded the way
    // it is to avoid divides (not that that really matters any more).
    if ( fabs(km-kp) > kp*km*radius_tolerance )
      // radii do not agree
      return true;
    bDifferentScalars = false;
  }

  if ( relative_tolerance > 0.0 )
  {
    if ( fabs(km-kp) > ((km>kp)?km:kp)*relative_tolerance )
    {
      return true;
    }
    bDifferentScalars = false;
  }

  if ( bPointOfInflection || bDifferentScalars )
  {
    // |Km - Kp| > curvature_tolerance and we were not asked to
    // perform and other tests.
    return true;
  }

  return false; // treat Km and Kp as equal curvatures.
}